

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing.cc
# Opt level: O2

void __thiscall wabt::TraceScope::~TraceScope(TraceScope *this)

{
  if (::(anonymous_namespace)::indent != 0) {
    ::(anonymous_namespace)::indent = ::(anonymous_namespace)::indent + -1;
  }
  anon_unknown.dwarf_b17ad62::Fill();
  fputs("<- ",_stderr);
  fputs(this->method_,_stderr);
  fputc(10,_stderr);
  return;
}

Assistant:

TraceScope::~TraceScope() {
  Dedent();
  fputs("<- ", stderr);
  fputs(method_, stderr);
  fputc('\n', stderr);
}